

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  PromiseNode *pPVar1;
  Own<capnp::PipelineHook> OVar2;
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  PropagateException local_59;
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  local_58;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  local_48;
  Own<kj::_::PromiseNode> local_28;
  
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Own<capnp::PipelineHook>>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,kj::_::PropagateException>
            (&local_28,(anon_class_1_0_00000001_for_func *)promise,&local_59);
  local_58.super_PromiseBase.node.disposer = local_28.disposer;
  local_58.super_PromiseBase.node.ptr = local_28.ptr;
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  ::split(&local_48,&local_58);
  pPVar1 = local_58.super_PromiseBase.node.ptr;
  if ((PipelineHook *)local_58.super_PromiseBase.node.ptr != (PipelineHook *)0x0) {
    local_58.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_58.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_58.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  OVar2 = newLocalPromisePipeline
                    ((capnp *)&local_28,
                     &local_48.impl.
                      super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value);
  pPVar1 = local_48.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
           super_PromiseBase.node.ptr;
  (__return_storage_ptr__->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>).
  super_PromiseBase.node.disposer =
       local_48.impl.
       super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
       .value.super_PromiseBase.node.disposer;
  (__return_storage_ptr__->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>).
  super_PromiseBase.node.ptr =
       local_48.impl.
       super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
       .value.super_PromiseBase.node.ptr;
  local_48.impl.
  super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
  .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.disposer = local_28.disposer;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.ptr = (PipelineHook *)local_28.ptr;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.size_ = 0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.disposer = (ArrayDisposer *)0x0;
  if (local_48.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
      super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_48.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_48.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
        super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_48.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.
               value.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,OVar2.ptr);
    pPVar1 = local_48.impl.
             super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
             .value.super_PromiseBase.node.ptr;
    if (local_48.impl.
        super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
        .value.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_48.impl.
      super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
      .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_48.impl.
          super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
          .value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_48.impl.
                 super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
                 .value.super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}